

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrix33.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChMatrix33<double>::Get_A_Rodriguez
          (ChVector<double> *__return_storage_ptr__,ChMatrix33<double> *this)

{
  undefined1 auVar1 [16];
  ChQuaternion<double> qtemp;
  undefined1 local_30 [24];
  double local_18;
  
  Get_A_quaternion((ChQuaternion<double> *)local_30,this);
  auVar1._8_8_ = local_30._0_8_;
  auVar1._0_8_ = local_30._0_8_;
  auVar1 = vdivpd_avx(local_30._8_16_,auVar1);
  *(undefined1 (*) [16])__return_storage_ptr__->m_data = auVar1;
  __return_storage_ptr__->m_data[2] = local_18 / (double)local_30._0_8_;
  return __return_storage_ptr__;
}

Assistant:

inline ChVector<Real> ChMatrix33<Real>::Get_A_Rodriguez() const {
    ChVector<Real> rod;
    ChQuaternion<Real> qtemp = Get_A_quaternion();
    // warning: infinite results may happen..
    rod.x() = qtemp.e1() / qtemp.e0();
    rod.y() = qtemp.e2() / qtemp.e0();
    rod.z() = qtemp.e3() / qtemp.e0();

    return rod;
}